

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void check_unpaid_usage(obj *otmp,boolean altusage)

{
  int iVar1;
  monst *mtmp;
  long amount;
  char *pcVar2;
  long tmp;
  char *arg2;
  char *arg1;
  char *fmt;
  monst *shkp;
  boolean altusage_local;
  obj *otmp_local;
  
  if (((((*(uint *)&otmp->field_0x4a >> 2 & 1) != 0) && (u.ushops[0] != '\0')) &&
      (('\0' < otmp->spe || (((byte)objects[otmp->otyp].field_0x10 >> 5 & 1) == 0)))) &&
     (((mtmp = shop_keeper(level,u.ushops[0]), mtmp != (monst *)0x0 &&
       (iVar1 = inhishop(mtmp), iVar1 != 0)) &&
      (amount = cost_per_charge(mtmp,otmp,altusage), amount != 0)))) {
    tmp = (long)"\n\n" + 2;
    arg2 = "";
    if (otmp->oclass == '\n') {
      arg1 = "%sYou owe%s %ld %s.";
      iVar1 = rn2(2);
      arg2 = "";
      if (iVar1 != 0) {
        arg2 = "This is no free library, cad!  ";
      }
      tmp = 0x3668bb;
      if (0 < *(int *)&mtmp[0x1b].field_0x60) {
        tmp = (long)" an additional";
      }
    }
    else if (otmp->otyp == 0x142) {
      arg1 = "%s%sThat will cost you %ld %s (Yendorian Fuel Tax).";
    }
    else {
      arg1 = "%s%sUsage fee, %ld %s.";
      iVar1 = rn2(3);
      if (iVar1 == 0) {
        arg2 = "Hey!  ";
      }
      iVar1 = rn2(3);
      if (iVar1 == 0) {
        tmp = (long)anon_var_dwarf_9d203;
      }
    }
    if (((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0) ||
       ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0)) {
      pcVar2 = currency(amount);
      verbalize(arg1,arg2,tmp,amount,pcVar2);
    }
    *(int *)&mtmp[0x1b].field_0x60 = *(int *)&mtmp[0x1b].field_0x60 + (int)amount;
    exercise(2,'\x01');
  }
  return;
}

Assistant:

void check_unpaid_usage(struct obj *otmp, boolean altusage)
{
	struct monst *shkp;
	const char *fmt, *arg1, *arg2;
	long tmp;

	if (!otmp->unpaid || !*u.ushops ||
		(otmp->spe <= 0 && objects[otmp->otyp].oc_charged))
	    return;
	if (!(shkp = shop_keeper(level, *u.ushops)) || !inhishop(shkp))
	    return;
	if ((tmp = cost_per_charge(shkp, otmp, altusage)) == 0L)
	    return;

	arg1 = arg2 = "";
	if (otmp->oclass == SPBOOK_CLASS) {
	    fmt = "%sYou owe%s %ld %s.";
	    arg1 = rn2(2) ? "This is no free library, cad!  " : "";
	    arg2 = ESHK(shkp)->debit > 0L ? " an additional" : "";
	} else if (otmp->otyp == POT_OIL) {
	    fmt = "%s%sThat will cost you %ld %s (Yendorian Fuel Tax).";
	} else {
	    fmt = "%s%sUsage fee, %ld %s.";
	    if (!rn2(3)) arg1 = "Hey!  ";
	    if (!rn2(3)) arg2 = "Ahem.  ";
	}

	if (shkp->mcanmove || !shkp->msleeping)
	    verbalize(fmt, arg1, arg2, tmp, currency(tmp));
	ESHK(shkp)->debit += tmp;
	exercise(A_WIS, TRUE);		/* you just got info */
}